

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O0

bool pstore::command_line::details::starts_with(string *s,czstring prefix)

{
  reference pcVar1;
  bool local_31;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator it;
  const_iterator end;
  czstring prefix_local;
  string *s_local;
  
  it = std::end<std::__cxx11::string>(s);
  local_30._M_current = (char *)std::begin<std::__cxx11::string>(s);
  end._M_current = prefix;
  while( true ) {
    local_31 = false;
    if (*end._M_current != '\0') {
      local_31 = __gnu_cxx::operator!=(&local_30,&it);
    }
    if (local_31 == false) break;
    pcVar1 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    if (*pcVar1 != *end._M_current) {
      return false;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30);
    end._M_current = end._M_current + 1;
  }
  return *end._M_current == '\0';
}

Assistant:

bool starts_with (std::string const & s, gsl::czstring prefix) {
                    auto const end = std::end (s);
                    for (auto it = std::begin (s); *prefix != '\0' && it != end; ++it, ++prefix) {
                        if (*it != *prefix) {
                            return false;
                        }
                    }
                    return *prefix == '\0';
                }